

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O1

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  int iVar89;
  uint uVar90;
  uint uVar91;
  long lVar92;
  long lVar93;
  int iVar94;
  long lVar95;
  float *pfVar96;
  float *pfVar97;
  float *pfVar98;
  float *pfVar99;
  undefined8 uVar100;
  undefined8 uVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  iVar15 = bottom_blob->c;
  if (0 < (long)iVar15) {
    uVar16 = top_blob->w;
    iVar17 = top_blob->h;
    pvVar18 = _bias->data;
    lVar93 = 0;
    do {
      if (pvVar18 == (void *)0x0) {
        uVar100 = 0;
        uVar105 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar18 + lVar93 * 0x10);
        uVar100 = *puVar1;
        uVar105 = puVar1[1];
      }
      local_128 = (float)uVar100;
      fStack_124 = (float)((ulong)uVar100 >> 0x20);
      fStack_120 = (float)uVar105;
      fStack_11c = (float)((ulong)uVar105 >> 0x20);
      if (0 < iVar17) {
        pfVar98 = (float *)(top_blob->cstep * lVar93 * top_blob->elemsize + (long)top_blob->data);
        lVar92 = kernel->w * lVar93 * kernel->elemsize;
        pvVar19 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar19 + lVar92);
        auVar84 = *pauVar2;
        auVar83 = *pauVar2;
        local_f8 = (float)*(undefined8 *)*pauVar2;
        fStack_f4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_f0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_ec = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar19 + lVar92 + 0x10);
        auVar81 = *pauVar2;
        auVar80 = *pauVar2;
        local_e8 = (float)*(undefined8 *)*pauVar2;
        fStack_e4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_e0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_dc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar19 + lVar92 + 0x20);
        auVar82 = *pauVar2;
        local_d8 = (float)*(undefined8 *)*pauVar2;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        auVar12 = *(undefined1 (*) [16])((long)pvVar19 + lVar92 + 0x30);
        auVar13 = *(undefined1 (*) [16])((long)pvVar19 + lVar92 + 0x40);
        pfVar97 = (float *)((long)pvVar19 + lVar92 + 0x50);
        fVar74 = *pfVar97;
        fVar75 = pfVar97[1];
        fVar76 = pfVar97[2];
        fVar77 = pfVar97[3];
        pauVar2 = (undefined1 (*) [12])((long)pvVar19 + lVar92 + 0x60);
        fVar66 = *(float *)*pauVar2;
        fVar67 = *(float *)(*pauVar2 + 4);
        fVar68 = *(float *)(*pauVar2 + 8);
        auVar87 = *pauVar2;
        auVar86 = *pauVar2;
        auVar85 = *pauVar2;
        fVar69 = *(float *)pauVar2[1];
        pauVar2 = (undefined1 (*) [12])((long)pvVar19 + lVar92 + 0x70);
        fVar70 = *(float *)*pauVar2;
        fVar71 = *(float *)(*pauVar2 + 4);
        fVar72 = *(float *)(*pauVar2 + 8);
        auVar88 = *pauVar2;
        fVar73 = *(float *)pauVar2[1];
        auVar14 = *(undefined1 (*) [16])((long)pvVar19 + lVar92 + 0x80);
        auVar106 = ZEXT1664(auVar14);
        pfVar99 = (float *)(bottom_blob->cstep * lVar93 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar92 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar97 = (float *)((long)pfVar99 + lVar92 * 2);
        pfVar96 = (float *)(lVar92 + (long)pfVar99);
        iVar94 = 0;
        do {
          local_138 = auVar12._0_4_;
          fStack_134 = auVar12._4_4_;
          fStack_12c = auVar12._12_4_;
          local_108 = auVar13._0_4_;
          fStack_104 = auVar13._4_4_;
          fStack_100 = auVar13._8_4_;
          fStack_fc = auVar13._12_4_;
          local_98 = auVar14._0_4_;
          fStack_94 = auVar14._4_4_;
          fStack_90 = auVar14._8_4_;
          fStack_8c = auVar14._12_4_;
          fStack_130 = auVar12._8_4_;
          if ((int)uVar16 < 8) {
            uVar91 = 0;
          }
          else {
            iVar89 = 7;
            do {
              fVar20 = pfVar99[1];
              fVar21 = pfVar99[2];
              fVar22 = pfVar99[3];
              fVar23 = pfVar99[4];
              fVar24 = pfVar99[5];
              fVar25 = pfVar99[6];
              fVar26 = pfVar99[7];
              fVar27 = pfVar99[8];
              fVar28 = pfVar99[9];
              fVar29 = pfVar99[10];
              fVar30 = pfVar99[0xb];
              fVar31 = pfVar99[0xc];
              fVar32 = pfVar99[0xd];
              fVar33 = pfVar99[0xe];
              fVar34 = pfVar99[0xf];
              fVar35 = pfVar96[1];
              fVar36 = pfVar96[2];
              fVar37 = pfVar96[3];
              fVar38 = pfVar96[4];
              fVar39 = pfVar96[5];
              fVar40 = pfVar96[6];
              fVar41 = pfVar96[7];
              fVar42 = pfVar96[8];
              fVar43 = pfVar96[9];
              fVar44 = pfVar96[10];
              fVar45 = pfVar96[0xb];
              fVar46 = pfVar96[0xc];
              fVar47 = pfVar96[0xd];
              fVar48 = pfVar96[0xe];
              fVar49 = pfVar96[0xf];
              fVar50 = pfVar97[1];
              fVar51 = pfVar97[2];
              fVar52 = pfVar97[3];
              fVar53 = pfVar97[4];
              fVar54 = pfVar97[5];
              fVar55 = pfVar97[6];
              fVar56 = pfVar97[7];
              fVar57 = pfVar97[8];
              fVar58 = pfVar97[9];
              fVar59 = pfVar97[10];
              fVar107 = pfVar97[0xb];
              fVar108 = pfVar97[0xc];
              fVar109 = pfVar97[0xd];
              fVar110 = pfVar97[0xe];
              fVar111 = pfVar97[0xf];
              *pfVar98 = local_f8 * *pfVar99 + local_128 + fVar27 * local_d8 + fVar23 * local_e8 +
                         local_138 * *pfVar96 + fVar38 * local_108 + fVar42 * fVar74 +
                         fVar66 * *pfVar97 + fVar53 * fVar70 + fVar57 * local_98;
              pfVar98[1] = fStack_f4 * fVar20 + fStack_124 + fVar28 * fStack_d4 + fVar24 * fStack_e4
                           + fStack_134 * fVar35 + fVar39 * fStack_104 + fVar43 * fVar75 +
                           fVar67 * fVar50 + fVar54 * fVar71 + fVar58 * fStack_94;
              pfVar98[2] = fStack_f0 * fVar21 + fStack_120 + fVar29 * fStack_d0 + fVar25 * fStack_e0
                           + fStack_130 * fVar36 + fVar40 * fStack_100 + fVar44 * fVar76 +
                           fVar68 * fVar51 + fVar55 * fVar72 + fVar59 * fStack_90;
              pfVar98[3] = fStack_ec * fVar22 + fStack_11c + fVar30 * fStack_cc + fVar26 * fStack_dc
                           + fStack_12c * fVar37 + fVar41 * fStack_fc + fVar45 * fVar77 +
                           fVar69 * fVar52 + fVar56 * fVar73 + fVar107 * fStack_8c;
              fVar35 = pfVar99[0x10];
              fVar36 = pfVar99[0x11];
              fVar37 = pfVar99[0x12];
              fVar50 = pfVar99[0x13];
              fVar51 = pfVar96[0x10];
              fVar52 = pfVar96[0x11];
              fVar112 = pfVar96[0x12];
              fVar113 = pfVar96[0x13];
              fVar114 = pfVar97[0x10];
              fVar115 = pfVar97[0x11];
              fVar60 = pfVar97[0x12];
              fVar61 = pfVar97[0x13];
              pfVar98[4] = fVar23 * local_f8 + local_128 + fVar38 * local_138 + fVar27 * local_e8 +
                           fVar42 * local_108 + fVar53 * fVar66 + fVar57 * fVar70 +
                           fVar31 * local_d8 + fVar46 * fVar74 + fVar108 * local_98;
              pfVar98[5] = fVar24 * fStack_f4 + fStack_124 +
                           fVar39 * fStack_134 + fVar28 * fStack_e4 +
                           fVar43 * fStack_104 + fVar54 * fVar67 + fVar58 * fVar71 +
                           fVar32 * fStack_d4 + fVar47 * fVar75 + fVar109 * fStack_94;
              pfVar98[6] = fVar25 * fStack_f0 + fStack_120 +
                           fVar40 * fStack_130 + fVar29 * fStack_e0 +
                           fVar44 * fStack_100 + fVar55 * fVar68 + fVar59 * fVar72 +
                           fVar33 * fStack_d0 + fVar48 * fVar76 + fVar110 * fStack_90;
              pfVar98[7] = fVar26 * fStack_ec + fStack_11c +
                           fVar41 * fStack_12c + fVar30 * fStack_dc +
                           fVar45 * fStack_fc + fVar56 * fVar69 + fVar107 * fVar73 +
                           fVar34 * fStack_cc + fVar49 * fVar77 + fVar111 * fStack_8c;
              fVar38 = pfVar99[0x14];
              fVar39 = pfVar99[0x15];
              fVar40 = pfVar99[0x16];
              fVar41 = pfVar99[0x17];
              fVar53 = pfVar96[0x14];
              fVar54 = pfVar96[0x15];
              fVar55 = pfVar96[0x16];
              fVar56 = pfVar96[0x17];
              fVar62 = pfVar97[0x14];
              fVar63 = pfVar97[0x15];
              fVar64 = pfVar97[0x16];
              fVar65 = pfVar97[0x17];
              pfVar98[8] = fVar114 * local_98 + fVar35 * local_d8 + fVar51 * fVar74 +
                           fVar27 * local_f8 + local_128 + fVar42 * local_138 + fVar57 * fVar66 +
                           fVar31 * local_e8 + fVar46 * local_108 + fVar108 * fVar70;
              pfVar98[9] = fVar115 * fStack_94 + fVar36 * fStack_d4 + fVar52 * fVar75 +
                           fVar28 * fStack_f4 + fStack_124 + fVar43 * fStack_134 + fVar58 * fVar67 +
                           fVar32 * fStack_e4 + fVar47 * fStack_104 + fVar109 * fVar71;
              pfVar98[10] = fVar60 * fStack_90 + fVar37 * fStack_d0 + fVar112 * fVar76 +
                            fVar29 * fStack_f0 + fStack_120 + fVar44 * fStack_130 + fVar59 * fVar68
                            + fVar33 * fStack_e0 + fVar48 * fStack_100 + fVar110 * fVar72;
              pfVar98[0xb] = fVar61 * fStack_8c + fVar50 * fStack_cc + fVar113 * fVar77 +
                             fVar30 * fStack_ec + fStack_11c +
                             fVar45 * fStack_12c + fVar107 * fVar69 +
                             fVar34 * fStack_dc + fVar49 * fStack_fc + fVar111 * fVar73;
              fVar27 = pfVar99[0x18];
              fVar28 = pfVar99[0x19];
              fVar29 = pfVar99[0x1a];
              fVar30 = pfVar99[0x1b];
              fVar42 = pfVar96[0x18];
              fVar43 = pfVar96[0x19];
              fVar44 = pfVar96[0x1a];
              fVar45 = pfVar96[0x1b];
              fVar57 = pfVar97[0x18];
              fVar58 = pfVar97[0x19];
              fVar59 = pfVar97[0x1a];
              fVar107 = pfVar97[0x1b];
              pfVar98[0xc] = fVar31 * local_f8 + local_128 + fVar46 * local_138 + fVar108 * fVar66 +
                             fVar35 * local_e8 + fVar51 * local_108 + fVar114 * fVar70 +
                             local_98 * fVar62 + fVar38 * local_d8 + fVar53 * fVar74;
              pfVar98[0xd] = fVar32 * fStack_f4 + fStack_124 +
                             fVar47 * fStack_134 + fVar109 * fVar67 +
                             fVar36 * fStack_e4 + fVar52 * fStack_104 + fVar115 * fVar71 +
                             fStack_94 * fVar63 + fVar39 * fStack_d4 + fVar54 * fVar75;
              pfVar98[0xe] = fVar33 * fStack_f0 + fStack_120 +
                             fVar48 * fStack_130 + fVar110 * fVar68 +
                             fVar37 * fStack_e0 + fVar112 * fStack_100 + fVar60 * fVar72 +
                             fStack_90 * fVar64 + fVar40 * fStack_d0 + fVar55 * fVar76;
              pfVar98[0xf] = fVar34 * fStack_ec + fStack_11c +
                             fVar49 * fStack_12c + fVar111 * fVar69 +
                             fVar50 * fStack_dc + fVar113 * fStack_fc + fVar61 * fVar73 +
                             fStack_8c * fVar65 + fVar41 * fStack_cc + fVar56 * fVar77;
              fVar31 = pfVar99[0x1c];
              fVar32 = pfVar99[0x1d];
              fVar33 = pfVar99[0x1e];
              fVar34 = pfVar99[0x1f];
              fVar20 = auVar80._0_4_;
              fVar22 = auVar80._4_4_;
              fVar24 = auVar80._8_4_;
              fVar46 = pfVar96[0x1c];
              fVar47 = pfVar96[0x1d];
              fVar48 = pfVar96[0x1e];
              fVar49 = pfVar96[0x1f];
              auVar104 = *(undefined1 (*) [16])(pfVar97 + 0x1c);
              fVar21 = auVar104._0_4_;
              fVar23 = auVar104._4_4_;
              fVar25 = auVar104._8_4_;
              fVar26 = auVar104._12_4_;
              pfVar98[0x10] =
                   fVar27 * local_d8 + fVar42 * fVar74 + fVar57 * local_98 +
                   fVar35 * local_f8 + local_128 + fVar51 * local_138 + fVar114 * fVar66 +
                   fVar38 * local_e8 + fVar53 * local_108 + fVar62 * fVar70;
              pfVar98[0x11] =
                   fVar28 * fStack_d4 + fVar43 * fVar75 + fVar58 * fStack_94 +
                   fVar36 * fStack_f4 + fStack_124 + fVar52 * fStack_134 + fVar115 * fVar67 +
                   fVar39 * fStack_e4 + fVar54 * fStack_104 + fVar63 * fVar71;
              pfVar98[0x12] =
                   fVar29 * fStack_d0 + fVar44 * fVar76 + fVar59 * fStack_90 +
                   fVar37 * fStack_f0 + fStack_120 + fVar112 * fStack_130 + fVar60 * fVar68 +
                   fVar40 * fStack_e0 + fVar55 * fStack_100 + fVar64 * fVar72;
              pfVar98[0x13] =
                   fVar30 * fStack_cc + fVar45 * fVar77 + fVar107 * fStack_8c +
                   fVar50 * fStack_ec + fStack_11c + fVar113 * fStack_12c + fVar61 * fVar69 +
                   fVar41 * fStack_dc + fVar56 * fStack_fc + fVar65 * fVar73;
              fVar35 = pfVar99[0x20];
              fVar36 = pfVar99[0x21];
              fVar37 = pfVar99[0x22];
              fVar50 = pfVar99[0x23];
              uVar100 = *(undefined8 *)(pfVar96 + 0x20);
              uVar105 = *(undefined8 *)(pfVar96 + 0x22);
              auVar104 = *(undefined1 (*) [16])(pfVar97 + 0x20);
              pfVar98[0x14] =
                   local_f8 * fVar38 + local_128 + fVar53 * local_138 + fVar62 * fVar66 +
                   fVar27 * fVar20 + fVar42 * local_108 + fVar57 * fVar70 +
                   local_d8 * fVar31 + fVar46 * fVar74 + local_98 * fVar21;
              pfVar98[0x15] =
                   fStack_f4 * fVar39 + fStack_124 + fVar54 * fStack_134 + fVar63 * fVar67 +
                   fVar28 * fVar22 + fVar43 * fStack_104 + fVar58 * fVar71 +
                   fStack_d4 * fVar32 + fVar47 * fVar75 + fStack_94 * fVar23;
              pfVar98[0x16] =
                   fStack_f0 * fVar40 + fStack_120 + fVar55 * fStack_130 + fVar64 * fVar68 +
                   fVar29 * fVar24 + fVar44 * fStack_100 + fVar59 * fVar72 +
                   fStack_d0 * fVar33 + fVar48 * fVar76 + fStack_90 * fVar25;
              pfVar98[0x17] =
                   fStack_ec * fVar41 + fStack_11c + fVar56 * fStack_12c + fVar65 * fVar69 +
                   fVar30 * fStack_dc + fVar45 * fStack_fc + fVar107 * fVar73 +
                   fStack_cc * fVar34 + fVar49 * fVar77 + fStack_8c * fVar26;
              local_b8 = (float)uVar100;
              fStack_b4 = (float)((ulong)uVar100 >> 0x20);
              fStack_b0 = (float)uVar105;
              fStack_ac = (float)((ulong)uVar105 >> 0x20);
              fVar38 = pfVar99[0x24];
              fVar39 = pfVar99[0x25];
              fVar40 = pfVar99[0x26];
              fVar41 = pfVar99[0x27];
              fVar51 = pfVar96[0x24];
              fVar52 = pfVar96[0x25];
              fVar53 = pfVar96[0x26];
              fVar54 = pfVar96[0x27];
              fVar55 = pfVar97[0x24];
              fVar56 = pfVar97[0x25];
              fVar108 = pfVar97[0x26];
              fVar109 = pfVar97[0x27];
              pfVar98[0x18] =
                   fVar27 * local_f8 + local_128 + auVar85._0_4_ * fVar57 + fVar42 * local_138 +
                   fVar20 * fVar31 + fVar46 * local_108 + fVar21 * fVar70 +
                   local_d8 * fVar35 + fVar74 * local_b8 + local_98 * auVar104._0_4_;
              pfVar98[0x19] =
                   fVar28 * fStack_f4 + fStack_124 + auVar85._4_4_ * fVar58 + fVar43 * fStack_134 +
                   fVar22 * fVar32 + fVar47 * fStack_104 + fVar23 * fVar71 +
                   fStack_d4 * fVar36 + fVar75 * fStack_b4 + fStack_94 * auVar104._4_4_;
              pfVar98[0x1a] =
                   fVar29 * fStack_f0 + fStack_120 + auVar85._8_4_ * fVar59 + fVar44 * fStack_130 +
                   fVar24 * fVar33 + fVar48 * fStack_100 + fVar25 * fVar72 +
                   fStack_d0 * fVar37 + fVar76 * fStack_b0 + fStack_90 * auVar104._8_4_;
              pfVar98[0x1b] =
                   fVar30 * fStack_ec + fStack_11c + fVar69 * fVar107 + fVar45 * fStack_12c +
                   fStack_dc * fVar34 + fVar49 * fStack_fc + fVar26 * fVar73 +
                   fStack_cc * fVar50 + fVar77 * fStack_ac + fStack_8c * auVar104._12_4_;
              auVar101._0_4_ =
                   local_f8 * fVar31 + local_128 + fVar46 * local_138 + auVar85._0_4_ * fVar21 +
                   fVar20 * fVar35 + local_108 * local_b8 + auVar104._0_4_ * fVar70 +
                   local_d8 * fVar38 + fVar74 * fVar51 + local_98 * fVar55;
              auVar101._4_4_ =
                   fStack_f4 * fVar32 + fStack_124 + fVar47 * fStack_134 + auVar85._4_4_ * fVar23 +
                   fVar22 * fVar36 + fStack_104 * fStack_b4 + auVar104._4_4_ * fVar71 +
                   fStack_d4 * fVar39 + fVar75 * fVar52 + fStack_94 * fVar56;
              auVar101._8_4_ =
                   fStack_f0 * fVar33 + fStack_120 + fVar48 * fStack_130 + auVar85._8_4_ * fVar25 +
                   fVar24 * fVar37 + fStack_100 * fStack_b0 + auVar104._8_4_ * fVar72 +
                   fStack_d0 * fVar40 + fVar76 * fVar53 + fStack_90 * fVar108;
              auVar101._12_4_ =
                   fStack_ec * fVar34 + fStack_11c + fVar49 * fStack_12c + fVar69 * fVar26 +
                   fStack_dc * fVar50 + fStack_fc * fStack_ac + auVar104._12_4_ * fVar73 +
                   fStack_cc * fVar41 + fVar77 * fVar54 + fStack_8c * fVar109;
              *(undefined1 (*) [16])(pfVar98 + 0x1c) = auVar101;
              pfVar99 = pfVar99 + 0x20;
              pfVar96 = pfVar96 + 0x20;
              pfVar97 = pfVar97 + 0x20;
              pfVar98 = pfVar98 + 0x20;
              iVar89 = iVar89 + 8;
            } while (iVar89 < (int)uVar16);
            auVar106 = ZEXT1664(auVar14);
            uVar91 = uVar16 & 0xfffffff8;
          }
          if ((int)(uVar91 | 3) < (int)uVar16) {
            lVar92 = 0;
            uVar90 = uVar91;
            do {
              pfVar3 = (float *)((long)pfVar99 + lVar92);
              fVar21 = pfVar3[1];
              fVar23 = pfVar3[2];
              fVar25 = pfVar3[3];
              pfVar4 = (float *)((long)pfVar99 + lVar92 + 0x10);
              fVar28 = *pfVar4;
              fVar29 = pfVar4[1];
              fVar30 = pfVar4[2];
              fVar31 = pfVar4[3];
              pfVar4 = (float *)((long)pfVar99 + lVar92 + 0x20);
              fVar32 = *pfVar4;
              fVar33 = pfVar4[1];
              fVar34 = pfVar4[2];
              fVar35 = pfVar4[3];
              puVar1 = (undefined8 *)((long)pfVar99 + lVar92 + 0x30);
              uVar100 = *puVar1;
              uVar105 = puVar1[1];
              fVar113 = auVar81._0_4_;
              fVar114 = auVar81._4_4_;
              fVar115 = auVar81._8_4_;
              fVar107 = auVar82._0_4_;
              fVar108 = auVar82._4_4_;
              fVar109 = auVar82._8_4_;
              pfVar4 = (float *)((long)pfVar96 + lVar92);
              fVar27 = pfVar4[1];
              fVar36 = pfVar4[2];
              fVar37 = pfVar4[3];
              pfVar5 = (float *)((long)pfVar96 + lVar92 + 0x10);
              fVar38 = *pfVar5;
              fVar39 = pfVar5[1];
              fVar40 = pfVar5[2];
              fVar41 = pfVar5[3];
              pfVar5 = (float *)((long)pfVar96 + lVar92 + 0x20);
              fVar42 = *pfVar5;
              fVar43 = pfVar5[1];
              fVar44 = pfVar5[2];
              fVar45 = pfVar5[3];
              puVar1 = (undefined8 *)((long)pfVar96 + lVar92 + 0x30);
              uVar78 = *puVar1;
              uVar79 = puVar1[1];
              pfVar10 = (float *)((long)pfVar97 + lVar92);
              fVar46 = pfVar10[1];
              fVar47 = pfVar10[2];
              fVar48 = pfVar10[3];
              fVar110 = auVar86._0_4_;
              fVar111 = auVar86._4_4_;
              fVar112 = auVar86._8_4_;
              pfVar5 = (float *)((long)pfVar97 + lVar92 + 0x10);
              fVar49 = *pfVar5;
              fVar50 = pfVar5[1];
              fVar51 = pfVar5[2];
              fVar52 = pfVar5[3];
              pfVar5 = (float *)((long)pfVar97 + lVar92 + 0x20);
              fVar53 = *pfVar5;
              fVar54 = pfVar5[1];
              fVar55 = pfVar5[2];
              fVar56 = pfVar5[3];
              auVar104 = *(undefined1 (*) [16])((long)pfVar97 + lVar92 + 0x30);
              fVar20 = auVar106._0_4_;
              fVar22 = auVar106._4_4_;
              fVar24 = auVar106._8_4_;
              fVar26 = auVar106._12_4_;
              pfVar5 = (float *)((long)pfVar98 + lVar92);
              *pfVar5 = local_f8 * *pfVar3 + local_128 + fVar113 * fVar28 + fVar107 * fVar32 +
                        local_138 * *pfVar4 + fVar38 * local_108 + fVar74 * fVar42 +
                        fVar53 * fVar20 + fVar49 * fVar70 + fVar110 * *pfVar10;
              pfVar5[1] = fStack_f4 * fVar21 + fStack_124 + fVar114 * fVar29 + fVar108 * fVar33 +
                          fStack_134 * fVar27 + fVar39 * fStack_104 + fVar75 * fVar43 +
                          fVar54 * fVar22 + fVar50 * fVar71 + fVar111 * fVar46;
              pfVar5[2] = fStack_f0 * fVar23 + fStack_120 + fVar115 * fVar30 + fVar109 * fVar34 +
                          fStack_130 * fVar36 + fVar40 * fStack_100 + fVar76 * fVar44 +
                          fVar55 * fVar24 + fVar51 * fVar72 + fVar112 * fVar47;
              pfVar5[3] = fStack_ec * fVar25 + fStack_11c + fStack_dc * fVar31 + fStack_cc * fVar35
                          + fStack_12c * fVar37 + fVar41 * fStack_fc + fVar77 * fVar45 +
                          fVar56 * fVar26 + fVar52 * fVar73 + fVar69 * fVar48;
              local_a8 = (float)uVar100;
              fStack_a4 = (float)((ulong)uVar100 >> 0x20);
              fStack_a0 = (float)uVar105;
              fStack_9c = (float)((ulong)uVar105 >> 0x20);
              local_b8 = (float)uVar78;
              fStack_b4 = (float)((ulong)uVar78 >> 0x20);
              fStack_b0 = (float)uVar79;
              fStack_ac = (float)((ulong)uVar79 >> 0x20);
              fVar21 = auVar104._0_4_;
              fVar23 = auVar104._4_4_;
              fVar25 = auVar104._8_4_;
              fVar27 = auVar104._12_4_;
              auVar104 = *(undefined1 (*) [16])((long)pfVar99 + lVar92 + 0x40);
              pfVar3 = (float *)((long)pfVar96 + lVar92 + 0x40);
              fVar36 = *pfVar3;
              fVar37 = pfVar3[1];
              fVar46 = pfVar3[2];
              fVar47 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar97 + lVar92 + 0x40);
              fVar48 = *pfVar3;
              fVar57 = pfVar3[1];
              fVar58 = pfVar3[2];
              fVar59 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar98 + lVar92 + 0x10);
              *pfVar3 = local_f8 * fVar28 + local_128 + fVar113 * fVar32 + fVar38 * local_138 +
                        fVar42 * local_108 + fVar49 * fVar110 + fVar53 * fVar70 +
                        fVar107 * local_a8 + local_b8 * fVar74 + fVar20 * fVar21;
              pfVar3[1] = fStack_f4 * fVar29 + fStack_124 + fVar114 * fVar33 + fVar39 * fStack_134 +
                          fVar43 * fStack_104 + fVar50 * fVar111 + fVar54 * fVar71 +
                          fVar108 * fStack_a4 + fStack_b4 * fVar75 + fVar22 * fVar23;
              pfVar3[2] = fStack_f0 * fVar30 + fStack_120 + fVar115 * fVar34 + fVar40 * fStack_130 +
                          fVar44 * fStack_100 + fVar51 * fVar112 + fVar55 * fVar72 +
                          fVar109 * fStack_a0 + fStack_b0 * fVar76 + fVar24 * fVar25;
              pfVar3[3] = fStack_ec * fVar31 + fStack_11c + fStack_dc * fVar35 + fVar41 * fStack_12c
                          + fVar45 * fStack_fc + fVar52 * fVar69 + fVar56 * fVar73 +
                          fStack_cc * fStack_9c + fStack_ac * fVar77 + fVar26 * fVar27;
              pfVar3 = (float *)((long)pfVar99 + lVar92 + 0x50);
              fVar28 = *pfVar3;
              fVar29 = pfVar3[1];
              fVar30 = pfVar3[2];
              fVar31 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar96 + lVar92 + 0x50);
              fVar38 = *pfVar3;
              fVar39 = pfVar3[1];
              fVar40 = pfVar3[2];
              fVar41 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar97 + lVar92 + 0x50);
              fVar49 = *pfVar3;
              fVar50 = pfVar3[1];
              fVar51 = pfVar3[2];
              fVar52 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar98 + lVar92 + 0x20);
              *pfVar3 = local_128 + auVar83._0_4_ * fVar32 + fVar42 * local_138 + fVar53 * fVar110 +
                        fVar113 * local_a8 + local_b8 * local_108 + fVar21 * fVar70 +
                        auVar104._0_4_ * fVar107 + fVar36 * fVar74 + fVar20 * fVar48;
              pfVar3[1] = fStack_124 + auVar83._4_4_ * fVar33 +
                          fVar43 * fStack_134 + fVar54 * fVar111 +
                          fVar114 * fStack_a4 + fStack_b4 * fStack_104 + fVar23 * fVar71 +
                          auVar104._4_4_ * fVar108 + fVar37 * fVar75 + fVar22 * fVar57;
              pfVar3[2] = fStack_120 + auVar83._8_4_ * fVar34 +
                          fVar44 * fStack_130 + fVar55 * fVar112 +
                          fVar115 * fStack_a0 + fStack_b0 * fStack_100 + fVar25 * fVar72 +
                          auVar104._8_4_ * fVar109 + fVar46 * fVar76 + fVar24 * fVar58;
              pfVar3[3] = fStack_11c + fStack_ec * fVar35 + fVar45 * fStack_12c + fVar56 * fVar69 +
                          fStack_dc * fStack_9c + fStack_ac * fStack_fc + fVar27 * fVar73 +
                          auVar104._12_4_ * fStack_cc + fVar47 * fVar77 + fVar26 * fVar59;
              auVar106 = ZEXT1664(auVar106._0_16_);
              auVar102._0_4_ =
                   local_128 + auVar83._0_4_ * local_a8 + local_b8 * local_138 + fVar110 * fVar21 +
                   auVar104._0_4_ * fVar113 + fVar36 * local_108 + fVar48 * fVar70 +
                   fVar107 * fVar28 + fVar74 * fVar38 + fVar20 * fVar49;
              auVar102._4_4_ =
                   fStack_124 + auVar83._4_4_ * fStack_a4 +
                   fStack_b4 * fStack_134 + fVar111 * fVar23 +
                   auVar104._4_4_ * fVar114 + fVar37 * fStack_104 + fVar57 * fVar71 +
                   fVar108 * fVar29 + fVar75 * fVar39 + fVar22 * fVar50;
              auVar102._8_4_ =
                   fStack_120 + auVar83._8_4_ * fStack_a0 +
                   fStack_b0 * fStack_130 + fVar112 * fVar25 +
                   auVar104._8_4_ * fVar115 + fVar46 * fStack_100 + fVar58 * fVar72 +
                   fVar109 * fVar30 + fVar76 * fVar40 + fVar24 * fVar51;
              auVar102._12_4_ =
                   fStack_11c + fStack_ec * fStack_9c + fStack_ac * fStack_12c + fVar69 * fVar27 +
                   auVar104._12_4_ * fStack_dc + fVar47 * fStack_fc + fVar59 * fVar73 +
                   fStack_cc * fVar31 + fVar77 * fVar41 + fVar26 * fVar52;
              *(undefined1 (*) [16])((long)pfVar98 + lVar92 + 0x30) = auVar102;
              uVar91 = uVar90 + 4;
              lVar92 = lVar92 + 0x40;
              iVar89 = uVar90 + 7;
              uVar90 = uVar91;
            } while (iVar89 < (int)uVar16);
            pfVar98 = (float *)((long)pfVar98 + lVar92);
            pfVar99 = (float *)((long)pfVar99 + lVar92);
            pfVar96 = (float *)((long)pfVar96 + lVar92);
            pfVar97 = (float *)((long)pfVar97 + lVar92);
          }
          if ((int)(uVar91 | 1) < (int)uVar16) {
            lVar92 = 0;
            uVar90 = uVar91;
            do {
              pfVar3 = (float *)((long)pfVar99 + lVar92 + 0x10);
              fVar20 = *pfVar3;
              fVar21 = pfVar3[1];
              fVar22 = pfVar3[2];
              fVar23 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar99 + lVar92 + 0x20);
              fVar24 = *pfVar3;
              fVar25 = pfVar3[1];
              fVar26 = pfVar3[2];
              fVar27 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar96 + lVar92 + 0x10);
              fVar28 = *pfVar3;
              fVar29 = pfVar3[1];
              fVar30 = pfVar3[2];
              fVar31 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar96 + lVar92 + 0x20);
              fVar32 = *pfVar3;
              fVar33 = pfVar3[1];
              fVar34 = pfVar3[2];
              fVar35 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar97 + lVar92 + 0x10);
              fVar36 = *pfVar3;
              fVar37 = pfVar3[1];
              fVar38 = pfVar3[2];
              fVar39 = pfVar3[3];
              pfVar3 = (float *)((long)pfVar99 + lVar92);
              fVar40 = pfVar3[1];
              fVar41 = pfVar3[2];
              fVar42 = pfVar3[3];
              auVar104 = *(undefined1 (*) [16])((long)pfVar97 + lVar92 + 0x20);
              pfVar4 = (float *)((long)pfVar96 + lVar92);
              fVar43 = pfVar4[1];
              fVar44 = pfVar4[2];
              fVar45 = pfVar4[3];
              pfVar10 = (float *)((long)pfVar97 + lVar92);
              fVar46 = pfVar10[1];
              fVar47 = pfVar10[2];
              fVar48 = pfVar10[3];
              pfVar5 = (float *)((long)pfVar99 + lVar92 + 0x30);
              fVar49 = *pfVar5;
              fVar50 = pfVar5[1];
              fVar51 = pfVar5[2];
              fVar52 = pfVar5[3];
              pfVar5 = (float *)((long)pfVar96 + lVar92 + 0x30);
              fVar53 = *pfVar5;
              fVar54 = pfVar5[1];
              fVar55 = pfVar5[2];
              fVar56 = pfVar5[3];
              pfVar5 = (float *)((long)pfVar97 + lVar92 + 0x30);
              fVar57 = *pfVar5;
              fVar58 = pfVar5[1];
              fVar59 = pfVar5[2];
              fVar107 = pfVar5[3];
              pfVar5 = (float *)((long)pfVar98 + lVar92);
              *pfVar5 = auVar87._0_4_ * *pfVar10 + fVar36 * auVar88._0_4_ +
                        auVar104._0_4_ * local_98 +
                        local_138 * *pfVar4 + fVar28 * local_108 + fVar32 * fVar74 +
                        fVar20 * local_e8 + fVar24 * local_d8 + local_128 + auVar84._0_4_ * *pfVar3;
              pfVar5[1] = auVar87._4_4_ * fVar46 + fVar37 * auVar88._4_4_ +
                          auVar104._4_4_ * fStack_94 +
                          fStack_134 * fVar43 + fVar29 * fStack_104 + fVar33 * fVar75 +
                          fVar21 * fStack_e4 + fVar25 * fStack_d4 +
                          fStack_124 + auVar84._4_4_ * fVar40;
              pfVar5[2] = auVar87._8_4_ * fVar47 + fVar38 * auVar88._8_4_ +
                          auVar104._8_4_ * fStack_90 +
                          fStack_130 * fVar44 + fVar30 * fStack_100 + fVar34 * fVar76 +
                          fVar22 * fStack_e0 + fVar26 * fStack_d0 +
                          fStack_120 + auVar84._8_4_ * fVar41;
              pfVar5[3] = fVar69 * fVar48 + fVar39 * fVar73 + auVar104._12_4_ * fStack_8c +
                          fStack_12c * fVar45 + fVar31 * fStack_fc + fVar35 * fVar77 +
                          fVar23 * fStack_dc + fVar27 * fStack_cc + fStack_11c + fStack_ec * fVar42;
              auVar103._0_4_ =
                   local_d8 * fVar49 + fVar74 * fVar53 + local_98 * fVar57 +
                   local_128 + auVar84._0_4_ * fVar20 + fVar24 * local_e8 + fVar28 * local_138 +
                   local_108 * fVar32 + auVar87._0_4_ * fVar36 + auVar104._0_4_ * auVar88._0_4_;
              auVar103._4_4_ =
                   fStack_d4 * fVar50 + fVar75 * fVar54 + fStack_94 * fVar58 +
                   fStack_124 + auVar84._4_4_ * fVar21 + fVar25 * fStack_e4 + fVar29 * fStack_134 +
                   fStack_104 * fVar33 + auVar87._4_4_ * fVar37 + auVar104._4_4_ * auVar88._4_4_;
              auVar103._8_4_ =
                   fStack_d0 * fVar51 + fVar76 * fVar55 + fStack_90 * fVar59 +
                   fStack_120 + auVar84._8_4_ * fVar22 + fVar26 * fStack_e0 + fVar30 * fStack_130 +
                   fStack_100 * fVar34 + auVar87._8_4_ * fVar38 + auVar104._8_4_ * auVar88._8_4_;
              auVar103._12_4_ =
                   fStack_cc * fVar52 + fVar77 * fVar56 + fStack_8c * fVar107 +
                   fStack_11c + fStack_ec * fVar23 + fVar27 * fStack_dc + fVar31 * fStack_12c +
                   fStack_fc * fVar35 + fVar69 * fVar39 + auVar104._12_4_ * fVar73;
              *(undefined1 (*) [16])((long)pfVar98 + lVar92 + 0x10) = auVar103;
              uVar91 = uVar90 + 2;
              lVar92 = lVar92 + 0x20;
              iVar89 = uVar90 + 3;
              uVar90 = uVar91;
            } while (iVar89 < (int)uVar16);
            pfVar98 = (float *)((long)pfVar98 + lVar92);
            pfVar99 = (float *)((long)pfVar99 + lVar92);
            pfVar96 = (float *)((long)pfVar96 + lVar92);
            pfVar97 = (float *)((long)pfVar97 + lVar92);
            auVar106 = ZEXT1664(auVar14);
          }
          iVar89 = uVar16 - uVar91;
          if (iVar89 != 0 && (int)uVar91 <= (int)uVar16) {
            lVar95 = 0x20;
            lVar92 = 0;
            do {
              pfVar5 = (float *)((long)pfVar99 + lVar95 + -0x20);
              pfVar10 = (float *)((long)pfVar99 + lVar95 + -0x10);
              pfVar3 = (float *)((long)pfVar99 + lVar95);
              pfVar6 = (float *)((long)pfVar96 + lVar95 + -0x20);
              pfVar7 = (float *)((long)pfVar96 + lVar95 + -0x10);
              pfVar4 = (float *)((long)pfVar96 + lVar95);
              pfVar8 = (float *)((long)pfVar97 + lVar95 + -0x20);
              pfVar9 = (float *)((long)pfVar97 + lVar95 + -0x10);
              pfVar11 = (float *)((long)pfVar97 + lVar95);
              auVar104._0_4_ =
                   local_f8 * *pfVar5 + local_128 + local_e8 * *pfVar10 + local_d8 * *pfVar3 +
                   local_138 * *pfVar6 + local_108 * *pfVar7 + fVar74 * *pfVar4 +
                   fVar66 * *pfVar8 + fVar70 * *pfVar9 + auVar106._0_4_ * *pfVar11;
              auVar104._4_4_ =
                   fStack_f4 * pfVar5[1] + fStack_124 +
                   fStack_e4 * pfVar10[1] + fStack_d4 * pfVar3[1] +
                   fStack_134 * pfVar6[1] + fStack_104 * pfVar7[1] + fVar75 * pfVar4[1] +
                   fVar67 * pfVar8[1] + fVar71 * pfVar9[1] + auVar106._4_4_ * pfVar11[1];
              auVar104._8_4_ =
                   fStack_f0 * pfVar5[2] + fStack_120 +
                   fStack_e0 * pfVar10[2] + fStack_d0 * pfVar3[2] +
                   fStack_130 * pfVar6[2] + fStack_100 * pfVar7[2] + fVar76 * pfVar4[2] +
                   fVar68 * pfVar8[2] + fVar72 * pfVar9[2] + auVar106._8_4_ * pfVar11[2];
              auVar104._12_4_ =
                   fStack_ec * pfVar5[3] + fStack_11c +
                   fStack_dc * pfVar10[3] + fStack_cc * pfVar3[3] +
                   fStack_12c * pfVar6[3] + fStack_fc * pfVar7[3] + fVar77 * pfVar4[3] +
                   fVar69 * pfVar8[3] + fVar73 * pfVar9[3] + auVar106._12_4_ * pfVar11[3];
              *(undefined1 (*) [16])((long)pfVar98 + lVar95 + -0x20) = auVar104;
              lVar92 = lVar92 + -0x10;
              lVar95 = lVar95 + 0x10;
              iVar89 = iVar89 + -1;
            } while (iVar89 != 0);
            pfVar98 = (float *)((long)pfVar98 - lVar92);
            pfVar99 = (float *)((long)pfVar99 - lVar92);
            pfVar96 = (float *)((long)pfVar96 - lVar92);
            pfVar97 = (float *)((long)pfVar97 - lVar92);
          }
          pfVar99 = pfVar99 + 8;
          pfVar96 = pfVar96 + 8;
          pfVar97 = pfVar97 + 8;
          iVar94 = iVar94 + 1;
        } while (iVar94 != iVar17);
      }
      lVar93 = lVar93 + 1;
    } while (lVar93 != iVar15);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_loadu_ps(k0);
        __m128 _k01 = _mm_loadu_ps(k0 + 4);
        __m128 _k02 = _mm_loadu_ps(k0 + 8);
        __m128 _k10 = _mm_loadu_ps(k0 + 12);
        __m128 _k11 = _mm_loadu_ps(k0 + 16);
        __m128 _k12 = _mm_loadu_ps(k0 + 20);
        __m128 _k20 = _mm_loadu_ps(k0 + 24);
        __m128 _k21 = _mm_loadu_ps(k0 + 28);
        __m128 _k22 = _mm_loadu_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_loadu_ps(r0 + 24);
                __m128 _r16 = _mm_loadu_ps(r1 + 24);
                __m128 _r26 = _mm_loadu_ps(r2 + 24);
                _mm_storeu_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_loadu_ps(r0 + 28);
                __m128 _r17 = _mm_loadu_ps(r1 + 28);
                __m128 _r27 = _mm_loadu_ps(r2 + 28);
                _mm_storeu_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_loadu_ps(r0 + 32);
                __m128 _r18 = _mm_loadu_ps(r1 + 32);
                __m128 _r28 = _mm_loadu_ps(r2 + 32);
                _mm_storeu_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_loadu_ps(r0 + 36);
                __m128 _r19 = _mm_loadu_ps(r1 + 36);
                __m128 _r29 = _mm_loadu_ps(r2 + 36);
                _mm_storeu_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_storeu_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_storeu_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_storeu_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_storeu_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}